

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_ipv4_tbl.c
# Opt level: O1

int ipv4_tbl_addr_cmp(zt_ipv4_addr *haystack,zt_ipv4_addr *needle)

{
  int iVar1;
  
  iVar1 = 0;
  if ((needle != (zt_ipv4_addr *)0x0 && haystack != (zt_ipv4_addr *)0x0) &&
     ((needle->addr < haystack->addr || (iVar1 = 1, haystack->broadcast < needle->broadcast)))) {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
ipv4_tbl_addr_cmp(zt_ipv4_addr * haystack, zt_ipv4_addr * needle)
{
    if (!haystack || !needle) {
        return 0;
    }

    if (needle->addr >= haystack->addr &&
        needle->broadcast <= haystack->broadcast) {
        return 1;
    }

    return 0;
}